

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O3

Nwk_Obj_t * Nwk_ManCreateCo(Nwk_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Nwk_Obj_t *pNVar4;
  void **ppvVar5;
  
  pNVar4 = Nwk_ManCreateObj(p,1,1);
  *(uint *)&pNVar4->field_0x20 = *(uint *)&pNVar4->field_0x20 & 0x7f | p->vCos->nSize << 7;
  pVVar3 = p->vCos;
  uVar1 = pVVar3->nSize;
  if (uVar1 == pVVar3->nCap) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = 0x10;
    }
    else {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar5;
      pVVar3->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar5 = pVVar3->pArray;
  }
  iVar2 = pVVar3->nSize;
  pVVar3->nSize = iVar2 + 1;
  ppvVar5[iVar2] = pNVar4;
  *(uint *)&pNVar4->field_0x20 = *(uint *)&pNVar4->field_0x20 & 0xfffffff8 | 2;
  p->nObjs[2] = p->nObjs[2] + 1;
  return pNVar4;
}

Assistant:

Nwk_Obj_t * Nwk_ManCreateCo( Nwk_Man_t * p )
{
    Nwk_Obj_t * pObj;
    pObj = Nwk_ManCreateObj( p, 1, 1 );
    pObj->PioId = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = NWK_OBJ_CO;
    p->nObjs[NWK_OBJ_CO]++;
    return pObj;
}